

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::GammaCorrection
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,double a,double gamma)

{
  imageException *this;
  uint16_t i;
  long lVar1;
  double dVar2;
  undefined1 auVar3 [16];
  allocator_type local_62;
  value_type_conflict2 local_61;
  double local_60;
  uint32_t local_54;
  double local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value;
  
  local_60 = gamma;
  local_50 = a;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  if ((0.0 <= local_50) && (0.0 <= local_60)) {
    local_61 = 0xff;
    local_54 = startYOut;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&value,0x100,&local_61,&local_62);
    for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
      dVar2 = pow((double)(int)(short)lVar1 / 255.0,local_60);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = dVar2 * local_50;
      auVar3 = vfmadd213sd_fma(auVar3,ZEXT816(0x406fe00000000000),ZEXT816(0x3fe0000000000000));
      if (auVar3._0_8_ < 256.0) {
        value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[lVar1] = (uchar)(int)auVar3._0_8_;
      }
    }
    LookupTable(in,startXIn,startYIn,out,startXOut,local_54,width,height,&value);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Gamma correction parameters are invalid");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void GammaCorrection( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                          uint32_t width, uint32_t height, double a, double gamma )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );

        if( a < 0 || gamma < 0 )
            throw imageException( "Gamma correction parameters are invalid" );

        // We precalculate all values and store them in lookup table
        std::vector < uint8_t > value( 256, 255u );

        for( uint16_t i = 0; i < 256; ++i ) {
            double data = a * pow( i / 255.0, gamma ) * 255 + 0.5;

            if( data < 256 )
                value[i] = static_cast<uint8_t>(data);
        }

        LookupTable( in, startXIn, startYIn, out, startXOut, startYOut, width, height, value );
    }